

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

MessageType __thiscall
cmMakefile::ExpandVariablesInStringOld
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  long lVar6;
  char *pcVar7;
  ostream *poVar8;
  undefined7 in_register_00000009;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar9;
  _Alloc_hider string;
  allocator local_2e1;
  cmMakefile *local_2e0;
  undefined4 local_2d4;
  string local_2d0;
  RegularExpression *local_2b0;
  char *local_2a8;
  string local_2a0;
  cmCommandArgumentParserHelper parser;
  string input;
  
  local_2d4 = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  local_2e0 = this;
  lVar6 = std::__cxx11::string::find_first_of((char *)source,0x49b04f);
  if (lVar6 == -1) {
    return LOG;
  }
  if (atOnly) {
    std::__cxx11::string::string((string *)&input,(string *)source);
    std::__cxx11::string::assign((char *)source);
    local_2b0 = &local_2e0->cmAtVarRegex;
    string = input._M_dataplus;
    while (bVar3 = cmsys::RegularExpression::find(local_2b0,string._M_p), bVar3) {
      pcVar7 = (local_2e0->cmAtVarRegex).searchstring;
      pcVar1 = (local_2e0->cmAtVarRegex).startp[0];
      pcVar2 = (local_2e0->cmAtVarRegex).endp[0];
      std::__cxx11::string::append((char *)source,(ulong)string._M_p);
      lVar6 = (long)pcVar2 - (long)pcVar7;
      parser._0_8_ = parser.BSLASHVariable;
      local_2a8 = string._M_p;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&parser,string._M_p + (long)(pcVar1 + (1 - (long)pcVar7)),
                 string._M_p + lVar6 + -1);
      pcVar7 = GetDefinition(local_2e0,(string *)&parser);
      if (pcVar7 != (char *)0x0) {
        if ((char)local_2d4 == '\0') {
          std::__cxx11::string::append((char *)source);
        }
        else {
          std::__cxx11::string::string((string *)&local_2a0,pcVar7,&local_2e1);
          cmSystemTools::EscapeQuotes(&local_2d0,&local_2a0);
          std::__cxx11::string::append((string *)source);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2a0);
        }
      }
      string._M_p = local_2a8 + lVar6;
      std::__cxx11::string::~string((string *)&parser);
    }
    std::__cxx11::string::append((char *)source);
    std::__cxx11::string::~string((string *)&input);
    return LOG;
  }
  cmCommandArgumentParserHelper::cmCommandArgumentParserHelper(&parser);
  cmCommandArgumentParserHelper::SetMakefile(&parser,local_2e0);
  cmCommandArgumentParserHelper::SetLineFile(&parser,line,filename);
  parser.EscapeQuotes = SUB41(local_2d4,0);
  parser.ReplaceAtSyntax = replaceAt;
  parser.RemoveEmpty = removeEmpty;
  parser.NoEscapeMode = noEscapes;
  iVar4 = cmCommandArgumentParserHelper::ParseString(&parser,(source->_M_dataplus)._M_p,0);
  if ((iVar4 != 0) && (*parser.ErrorString._M_dataplus._M_p == '\0')) {
    std::__cxx11::string::_M_assign((string *)source);
    MVar9 = LOG;
    goto LAB_0037e7bc;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&input);
  std::operator<<((ostream *)&input,"Syntax error in cmake code ");
  if (0 < line && filename != (char *)0x0) {
    poVar8 = std::operator<<((ostream *)&input,"at\n");
    poVar8 = std::operator<<(poVar8,"  ");
    poVar8 = std::operator<<(poVar8,filename);
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    std::operator<<(poVar8,"\n");
  }
  poVar8 = std::operator<<((ostream *)&input,"when parsing string\n");
  poVar8 = std::operator<<(poVar8,"  ");
  poVar8 = std::operator<<(poVar8,(string *)source);
  std::operator<<(poVar8,"\n");
  std::operator<<((ostream *)&input,parser.ErrorString._M_dataplus._M_p);
  MVar9 = FATAL_ERROR;
  if (iVar4 == 0) {
    PVar5 = cmState::Snapshot::GetPolicy(&local_2e0->StateSnapshot,CMP0010);
    if (PVar5 - REQUIRED_IF_USED < 2) {
      poVar8 = std::operator<<((ostream *)&input,"\n");
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_2d0,(cmPolicies *)0xa,id_00);
      std::operator<<(poVar8,(string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    else {
      if (PVar5 != OLD) {
        if (PVar5 != WARN) goto LAB_0037e6da;
        poVar8 = std::operator<<((ostream *)&input,"\n");
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2d0,(cmPolicies *)0xa,id);
        std::operator<<(poVar8,(string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
      }
      MVar9 = AUTHOR_WARNING;
    }
  }
LAB_0037e6da:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)errorstr,(string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&input);
LAB_0037e7bc:
  cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper(&parser);
  return MVar9;
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringOld(
                                                std::string& errorstr,
                                                std::string& source,
                                                bool escapeQuotes,
                                                bool noEscapes,
                                                bool atOnly,
                                                const char* filename,
                                                long line,
                                                bool removeEmpty,
                                                bool replaceAt) const
{
  // Fast path strings without any special characters.
  if ( source.find_first_of("$@\\") == source.npos)
    {
    return cmake::LOG;
    }

  // Special-case the @ONLY mode.
  if(atOnly)
    {
    // Store an original copy of the input.
    std::string input = source;

    // Start with empty output.
    source = "";

    // Look for one @VAR@ at a time.
    const char* in = input.c_str();
    while(this->cmAtVarRegex.find(in))
      {
      // Get the range of the string to replace.
      const char* first = in + this->cmAtVarRegex.start();
      const char* last =  in + this->cmAtVarRegex.end();

      // Store the unchanged part of the string now.
      source.append(in, first-in);

      // Lookup the definition of VAR.
      std::string var(first+1, last-first-2);
      if(const char* val = this->GetDefinition(var))
        {
        // Store the value in the output escaping as requested.
        if(escapeQuotes)
          {
          source.append(cmSystemTools::EscapeQuotes(val));
          }
        else
          {
          source.append(val);
          }
        }

      // Continue looking for @VAR@ further along the string.
      in = last;
      }

    // Append the rest of the unchanged part of the string.
    source.append(in);

    return cmake::LOG;
    }

  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  cmCommandArgumentParserHelper parser;
  parser.SetMakefile(this);
  parser.SetLineFile(line, filename);
  parser.SetEscapeQuotes(escapeQuotes);
  parser.SetNoEscapeMode(noEscapes);
  parser.SetReplaceAtSyntax(replaceAt);
  parser.SetRemoveEmpty(removeEmpty);
  int res = parser.ParseString(source.c_str(), 0);
  const char* emsg = parser.GetError();
  cmake::MessageType mtype = cmake::LOG;
  if ( res && !emsg[0] )
    {
    source = parser.GetResult();
    }
  else
    {
    // Construct the main error message.
    std::ostringstream error;
    error << "Syntax error in cmake code ";
    if(filename && line > 0)
      {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      error << "at\n"
            << "  " << filename << ":" << line << "\n";
      }
    error << "when parsing string\n"
          << "  " << source << "\n";
    error << emsg;

    // If the parser failed ("res" is false) then this is a real
    // argument parsing error, so the policy applies.  Otherwise the
    // parser reported an error message without failing because the
    // helper implementation is unhappy, which has always reported an
    // error.
    mtype = cmake::FATAL_ERROR;
    if(!res)
      {
      // This is a real argument parsing error.  Use policy CMP0010 to
      // decide whether it is an error.
      switch(this->GetPolicyStatus(cmPolicies::CMP0010))
        {
        case cmPolicies::WARN:
          error << "\n" << cmPolicies::GetPolicyWarning(cmPolicies::CMP0010);
        case cmPolicies::OLD:
          // OLD behavior is to just warn and continue.
          mtype = cmake::AUTHOR_WARNING;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          error << "\n"
                << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0010);
        case cmPolicies::NEW:
          // NEW behavior is to report the error.
          break;
        }
      }
    errorstr = error.str();
    }
  return mtype;
}